

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintTo(char32_t *s,ostream *os)

{
  ostream *poVar1;
  size_t len;
  
  if (s != (char32_t *)0x0) {
    poVar1 = std::ostream::_M_insert<void_const*>(os);
    std::operator<<(poVar1," pointing to ");
    len = std::char_traits<char32_t>::length(s);
    PrintCharsAsStringTo<char32_t>(s,len,os);
    return;
  }
  std::operator<<((ostream *)os,"NULL");
  return;
}

Assistant:

void PrintTo(const char32_t* s, ostream* os) { PrintCStringTo(s, os); }